

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_restoredata(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,
                     IRRef ref,void *dst,CTSize sz)

{
  uint uVar1;
  undefined1 auStack_58 [4];
  Reg r;
  uint64_t tmp;
  int32_t *src;
  IRIns *pIStack_40;
  RegSP rs;
  IRIns *ir;
  BloomFilter BStack_30;
  IRRef ref_local;
  BloomFilter rfilt_local;
  ExitState *pEStack_20;
  SnapNo snapno_local;
  ExitState *ex_local;
  GCtrace *T_local;
  jit_State *J_local;
  
  tmp = (uint64_t)(T->ir + ref);
  src._4_4_ = (uint)((anon_struct_8_4_c535eab0_for_IRIns_0 *)tmp)->prev;
  if (ref < 0x8000) {
    if ((((((anon_struct_8_5_4e98db7e_for_IRIns_2 *)tmp)->o == '\x1c') ||
         (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)tmp)->o == '\x1d')) ||
        (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)tmp)->o == '\x18')) ||
       ((((anon_struct_8_5_4e98db7e_for_IRIns_2 *)tmp)->o == '\x19' ||
        (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)tmp)->o == '\x1a')))) {
      tmp = tmp + 8;
    }
    else if (sz == 8) {
      tmp = (uint64_t)auStack_58;
    }
  }
  else {
    pIStack_40 = (IRIns *)tmp;
    ir._4_4_ = ref;
    BStack_30 = rfilt;
    rfilt_local._4_4_ = snapno;
    pEStack_20 = ex;
    ex_local = (ExitState *)T;
    T_local = &J->cur;
    if ((rfilt & 1L << ((byte)ref & 0x3f)) != 0) {
      src._4_4_ = snap_renameref(T,snapno,ref,src._4_4_);
    }
    if (src._4_4_ >> 8 == 0) {
      uVar1 = src._4_4_ & 0xff;
      if ((src._4_4_ & 0x80) != 0) {
        snap_restoredata((jit_State *)T_local,(GCtrace *)ex_local,pEStack_20,rfilt_local._4_4_,
                         BStack_30,(uint)(pIStack_40->field_0).op1,dst,4);
        *(double *)dst = (double)*dst;
        return;
      }
      tmp = (uint64_t)(pEStack_20->gpr + uVar1);
      if (0xf < uVar1) {
        tmp = (uint64_t)(pEStack_20->fpr + (uVar1 - 0x10));
      }
    }
    else {
      tmp = (uint64_t)(pEStack_20->spill + (src._4_4_ >> 8));
      if ((sz == 8) && ((0x605fd9U >> ((pIStack_40->field_1).t.irt & 0x1f) & 1) == 0)) {
        tmp = (uint64_t)auStack_58;
      }
    }
  }
  if (sz == 4) {
    *(undefined4 *)dst = *(undefined4 *)tmp;
  }
  else if (sz == 8) {
    *(undefined8 *)dst = *(undefined8 *)tmp;
  }
  else if (sz == 1) {
    *(char *)dst = (char)*(undefined4 *)tmp;
  }
  else {
    *(short *)dst = (short)*(undefined4 *)tmp;
  }
  return;
}

Assistant:

static void snap_restoredata(jit_State *J, GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  UNUSED(J);
  if (irref_isk(ref)) {
    if (ir_isk64(ir)) {
      src = (int32_t *)&ir[1];
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lj_assertJ(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "restore from IR %04d has no reg", ref - REF_BIAS);
	snap_restoredata(J, T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
      src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      } else
#endif
      if (LJ_64 && LJ_BE && sz == 4) src++;
    }
  }
  lj_assertJ(sz == 1 || sz == 2 || sz == 4 || sz == 8,
	     "restore from IR %04d with bad size %d", ref - REF_BIAS, sz);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}